

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

void Saig_ManDemiterLabel_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int Value)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int Value_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    if (Value == 0) {
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef | 0x10;
    }
    else {
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    iVar1 = Saig_ObjIsPi(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                        ,0x357,"void Saig_ManDemiterLabel_rec(Aig_Man_t *, Aig_Obj_t *, int)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManDemiterLabel_rec(p,pAVar2,Value);
        pAVar2 = Aig_ObjFanin1(pObj);
        Saig_ManDemiterLabel_rec(p,pAVar2,Value);
      }
      else {
        pAVar2 = Saig_ObjLoToLi(p,pObj);
        pAVar2 = Aig_ObjFanin0(pAVar2);
        Saig_ManDemiterLabel_rec(p,pAVar2,Value);
      }
    }
  }
  return;
}

Assistant:

void Saig_ManDemiterLabel_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int Value )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Value ) 
        pObj->fMarkB = 1;
    else
        pObj->fMarkA = 1;
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ), Value );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0(pObj), Value );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin1(pObj), Value );
}